

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.h
# Opt level: O1

void __thiscall crnlib::texture_conversion::convert_stats::~convert_stats(convert_stats *this)

{
  char *pcVar1;
  
  mipmapped_texture::~mipmapped_texture(&this->m_output_tex);
  pcVar1 = (this->m_dst_filename).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  pcVar1 = (this->m_src_filename).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  return;
}

Assistant:

class CRN_EXPORT convert_stats
        {
        public:
            convert_stats();

            bool init(const char* pSrc_filename, const char* pDst_filename, mipmapped_texture& src_tex,
                texture_file_types::format dst_file_type, bool lzma_stats);

            bool print(bool psnr_metrics, bool mip_stats, bool grayscale_sampling, const char* pCSVStatsFile = nullptr) const;

            void clear();

            dynamic_string m_src_filename;
            dynamic_string m_dst_filename;
            texture_file_types::format m_dst_file_type;

            mipmapped_texture* m_pInput_tex;
            mipmapped_texture m_output_tex;

            uint64 m_input_file_size;
            uint m_total_input_pixels;

            uint64 m_output_file_size;
            uint m_total_output_pixels;

            uint64 m_output_comp_file_size;
        }